

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O2

void NULLCCanvas::CanvasDrawPoint(double x,double y,Canvas *ptr)

{
  uint y_00;
  uint x_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (ptr != (Canvas *)0x0) {
    y_00 = (uint)(long)y;
    x_00 = (uint)(long)x;
    if (ptr->aaEnabled == true) {
      dVar1 = floor(x);
      dVar3 = (dVar1 - x) + 1.0;
      dVar2 = floor(y);
      dVar4 = (dVar2 - y) + 1.0;
      CanvasDrawPointInternal(x_00,y_00,dVar3 * dVar4,ptr);
      CanvasDrawPointInternal(x_00 + 1,y_00,dVar4 * (x - dVar1),ptr);
      y_00 = y_00 + 1;
      CanvasDrawPointInternal(x_00,y_00,dVar3 * (y - dVar2),ptr);
      dVar1 = (y - dVar2) * (x - dVar1);
      x_00 = x_00 + 1;
    }
    else {
      dVar1 = 1.0;
    }
    CanvasDrawPointInternal(x_00,y_00,dVar1,ptr);
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasDrawPoint(double x, double y, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		unsigned xx = unsigned(x);
		unsigned yy = unsigned(y);
		if(ptr->aaEnabled)
		{
			CanvasDrawPointInternal(xx, yy, rfpart(x) * rfpart(y), ptr);
			CanvasDrawPointInternal(xx + 1, yy, fpart(x) * rfpart(y), ptr);
			CanvasDrawPointInternal(xx, yy + 1, rfpart(x) * fpart(y), ptr);
			CanvasDrawPointInternal(xx + 1, yy + 1, fpart(x) * fpart(y), ptr);
		}else{
			CanvasDrawPointInternal(xx, yy, 1.0, ptr);
		}
	}